

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  pointer pTVar5;
  TextAttributes *pTVar6;
  unsigned_long *puVar7;
  TestCaseInfo *pTVar8;
  size_t sVar9;
  string *psVar10;
  ulong uVar11;
  long lVar12;
  ostream *poVar13;
  Config *in_RDI;
  Colour colourGuard_1;
  Colour colourGuard;
  string nameCol;
  Code colour;
  size_t i;
  Text tagsWrapper;
  Text nameWrapper;
  size_t matchedTests;
  size_t maxNameLen;
  size_t maxTagLen;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTests;
  pluralise *in_stack_fffffffffffffca8;
  TestCase *in_stack_fffffffffffffcb0;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_fffffffffffffcb8
  ;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *in_stack_fffffffffffffcc0
  ;
  allocator *paVar14;
  allocator local_281;
  string local_280 [79];
  allocator local_231;
  string local_230 [79];
  allocator local_1e1;
  TextAttributes *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  Text *in_stack_fffffffffffffe30;
  allocator local_1b9;
  string local_1b8 [40];
  string local_190 [36];
  undefined4 local_16c;
  size_t local_168;
  size_t local_160;
  ulong local_158;
  TextAttributes local_140 [3];
  TextAttributes local_c8 [3];
  TestCase *local_50;
  size_t local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  TestCase *local_20;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_18;
  undefined8 local_10;
  Config *local_8;
  
  local_8 = in_RDI;
  Config::filters(in_RDI);
  bVar2 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (in_stack_fffffffffffffcc0);
  if (bVar2) {
    std::operator<<((ostream *)&std::cout,"All available test cases:\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
  }
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])();
  local_10 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
  local_18._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_fffffffffffffca8);
  local_20 = (TestCase *)
             std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        in_stack_fffffffffffffca8);
  local_28 = 0;
  local_30 = 0;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffca8), bVar2) {
    Config::filters(local_8);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(&local_18);
    bVar2 = matchesFilters(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    if (bVar2) {
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&local_18);
      TestCase::getTestCaseInfo(pTVar5);
      local_38 = std::__cxx11::string::size();
      puVar7 = std::max<unsigned_long>(&local_38,&local_28);
      local_28 = *puVar7;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&local_18);
      TestCase::getTestCaseInfo(pTVar5);
      local_40 = std::__cxx11::string::size();
      puVar7 = std::max<unsigned_long>(&local_40,&local_30);
      local_30 = *puVar7;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_18);
  }
  while (0x4b < local_28 + local_30) {
    if (local_28 < 0x1f) {
      local_30 = local_30 - 1;
    }
    else {
      local_28 = local_28 - 1;
    }
  }
  local_48 = 0;
  local_50 = (TestCase *)
             std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        in_stack_fffffffffffffca8);
  local_18._M_current = local_50;
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffcb0,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffca8), bVar2) {
    Config::filters(local_8);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(&local_18);
    bVar2 = matchesFilters(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    if (bVar2) {
      local_48 = local_48 + 1;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&local_18);
      TestCase::getTestCaseInfo(pTVar5);
      TextAttributes::TextAttributes(local_c8);
      pTVar6 = TextAttributes::setWidth(local_c8,local_30);
      pTVar6 = TextAttributes::setInitialIndent(pTVar6,2);
      TextAttributes::setIndent(pTVar6,4);
      Text::Text(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&local_18);
      TestCase::getTestCaseInfo(pTVar5);
      TextAttributes::TextAttributes(local_140);
      pTVar6 = TextAttributes::setWidth(local_140,local_28);
      pTVar6 = TextAttributes::setInitialIndent(pTVar6,0);
      TextAttributes::setIndent(pTVar6,2);
      Text::Text(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      local_158 = 0;
      while( true ) {
        uVar11 = local_158;
        local_160 = Text::size((Text *)0x1c64a1);
        local_168 = Text::size((Text *)0x1c64b6);
        puVar7 = std::max<unsigned_long>(&local_160,&local_168);
        if (*puVar7 <= uVar11) break;
        local_16c = 0;
        pTVar5 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator->(&local_18);
        pTVar8 = TestCase::getTestCaseInfo(pTVar5);
        if ((pTVar8->isHidden & 1U) != 0) {
          local_16c = 0x17;
        }
        std::__cxx11::string::string(local_190);
        uVar11 = local_158;
        sVar9 = Text::size((Text *)0x1c6560);
        if (uVar11 < sVar9) {
          psVar10 = Text::operator[][abi_cxx11_
                              ((Text *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
          std::__cxx11::string::operator=(local_190,(string *)psVar10);
        }
        else {
          std::__cxx11::string::operator=(local_190,"    ...");
          local_16c = 0x17;
        }
        Colour::Colour((Colour *)in_stack_fffffffffffffcb0,
                       (Code)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        std::operator<<((ostream *)&std::cout,local_190);
        Colour::~Colour((Colour *)0x1c660c);
        uVar11 = local_158;
        sVar9 = Text::size((Text *)0x1c6629);
        if (uVar11 < sVar9) {
          Text::operator[][abi_cxx11_
                    ((Text *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8);
          uVar11 = std::__cxx11::string::empty();
          uVar1 = local_30;
          if ((uVar11 & 1) == 0) {
            if (local_158 == 0) {
              Colour::Colour((Colour *)in_stack_fffffffffffffcb0,
                             (Code)((ulong)in_stack_fffffffffffffca8 >> 0x20));
              poVar13 = std::operator<<((ostream *)&std::cout,"  ");
              uVar1 = local_30;
              lVar12 = std::__cxx11::string::size();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1b8,uVar1 - lVar12,'.',&local_1b9);
              poVar13 = std::operator<<(poVar13,local_1b8);
              std::operator<<(poVar13,"  ");
              std::__cxx11::string::~string(local_1b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
              Colour::~Colour((Colour *)0x1c6752);
            }
            else {
              lVar12 = std::__cxx11::string::size();
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&stack0xfffffffffffffe20,uVar1 - lVar12,' ',&local_1e1);
              poVar13 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffe20);
              std::operator<<(poVar13,"    ");
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
            }
            psVar10 = Text::operator[][abi_cxx11_
                                ((Text *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8
                                );
            std::operator<<((ostream *)&std::cout,(string *)psVar10);
          }
        }
        std::operator<<((ostream *)&std::cout,"\n");
        std::__cxx11::string::~string(local_190);
        local_158 = local_158 + 1;
      }
      Text::~Text((Text *)in_stack_fffffffffffffcb0);
      Text::~Text((Text *)in_stack_fffffffffffffcb0);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_18);
  }
  Config::filters(local_8);
  bVar2 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (in_stack_fffffffffffffcc0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"test case",&local_231);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (string *)0x1c6a06);
    poVar13 = operator<<((ostream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    poVar13 = std::operator<<(poVar13,"\n");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x1c6a5b);
    std::__cxx11::string::~string(local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  else {
    paVar14 = &local_281;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_280,"matching test case",paVar14);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (string *)0x1c6b3a);
    poVar13 = operator<<((ostream *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    poVar13 = std::operator<<(poVar13,"\n");
    std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x1c6b8d);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  return local_48;
}

Assistant:

inline std::size_t listTests( Config const& config ) {
        if( config.filters().empty() )
            std::cout << "All available test cases:\n";
        else
            std::cout << "Matching test cases:\n";
        std::vector<TestCase> const& allTests = getRegistryHub().getTestCaseRegistry().getAllTests();
        std::vector<TestCase>::const_iterator it = allTests.begin(), itEnd = allTests.end();

        // First pass - get max tags
        std::size_t maxTagLen = 0;
        std::size_t maxNameLen = 0;
        for(; it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                maxTagLen = (std::max)( it->getTestCaseInfo().tagsAsString.size(), maxTagLen );
                maxNameLen = (std::max)( it->getTestCaseInfo().name.size(), maxNameLen );
            }
        }

        // Try to fit everything in. If not shrink tag column first, down to 30
        // then shrink name column until it all fits (strings will be wrapped within column)
        while( maxTagLen + maxNameLen > CATCH_CONFIG_CONSOLE_WIDTH-5 ) {
            if( maxTagLen > 30 )
                --maxTagLen;
            else
                --maxNameLen;
        }

        std::size_t matchedTests = 0;
        for( it = allTests.begin(); it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                matchedTests++;
                Text nameWrapper(   it->getTestCaseInfo().name,
                                    TextAttributes()
                                        .setWidth( maxNameLen )
                                        .setInitialIndent(2)
                                        .setIndent(4) );

                Text tagsWrapper(   it->getTestCaseInfo().tagsAsString,
                                    TextAttributes()
                                        .setWidth( maxTagLen )
                                        .setInitialIndent(0)
                                        .setIndent( 2 ) );

                for( std::size_t i = 0; i < (std::max)( nameWrapper.size(), tagsWrapper.size() ); ++i ) {
                    Colour::Code colour = Colour::None;
                    if( it->getTestCaseInfo().isHidden )
                        colour = Colour::SecondaryText;
                    std::string nameCol;
                    if( i < nameWrapper.size() ) {
                        nameCol = nameWrapper[i];
                    }
                    else {
                        nameCol = "    ...";
                        colour = Colour::SecondaryText;
                    }

                    {
                        Colour colourGuard( colour );
                        std::cout << nameCol;
                    }
                    if( i < tagsWrapper.size() && !tagsWrapper[i].empty() ) {
                        if( i == 0 ) {
                            Colour colourGuard( Colour::SecondaryText );
                            std::cout << "  " << std::string( maxNameLen - nameCol.size(), '.' ) << "  ";
                        }
                        else {
                            std::cout << std::string( maxNameLen - nameCol.size(), ' ' ) << "    ";
                        }
                        std::cout << tagsWrapper[i];
                    }
                    std::cout << "\n";
                }
            }
        }
        if( config.filters().empty() )
            std::cout << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            std::cout << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }